

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void change_attackrate(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  int local_40;
  byte local_3c;
  double f;
  Bits step_num;
  Bits steps;
  Bits step_skip;
  Bits attackrate;
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  OPL_DATA_conflict *chip_local;
  
  iVar1 = (int)(uint)chip->adlibreg[regbase + 0x60] >> 4;
  if (iVar1 == 0) {
    op_pt->a0 = 0.0;
    op_pt->a1 = 1.0;
    op_pt->a2 = 0.0;
    op_pt->a3 = 0.0;
    op_pt->env_step_a = 0;
    op_pt->env_step_skip_a = 0;
  }
  else {
    dVar3 = pow(2.0,((double)iVar1 + (double)(op_pt->toff >> 2)) - 1.0);
    dVar3 = dVar3 * attackconst[op_pt->toff & 3] * chip->recipsamp;
    op_pt->a0 = dVar3 * 0.0377;
    op_pt->a1 = dVar3 * 10.73 + 1.0;
    op_pt->a2 = dVar3 * -17.57;
    op_pt->a3 = dVar3 * 7.42;
    uVar2 = iVar1 * 4 + op_pt->toff;
    if ((int)uVar2 >> 2 < 0xd) {
      local_3c = 0xc - (char)((int)uVar2 >> 2);
    }
    else {
      local_3c = 0;
    }
    op_pt->env_step_a = (1 << (local_3c & 0x1f)) + -1;
    if ((int)uVar2 < 0x31) {
      local_40 = 4 - (uVar2 & 3);
    }
    else {
      local_40 = 0;
    }
    op_pt->env_step_skip_a = (uint)change_attackrate::step_skip_mask[local_40];
    if (0x3b < (int)uVar2) {
      op_pt->a0 = 2.0;
      op_pt->a1 = 0.0;
      op_pt->a2 = 0.0;
      op_pt->a3 = 0.0;
    }
  }
  return;
}

Assistant:

static void change_attackrate(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
	Bits attackrate = chip->adlibreg[ARC_ATTR_DECR+regbase]>>4;
	if (attackrate)
	{
		static Bit8u step_skip_mask[5] = {0xff, 0xfe, 0xee, 0xba, 0xaa}; 
		Bits step_skip;
		Bits steps;
		Bits step_num;
		
		fltype f = (fltype)(pow(FL2,(fltype)attackrate+(op_pt->toff>>2)-1)*attackconst[op_pt->toff&3]*chip->recipsamp);
		// attack rate coefficients
		op_pt->a0 = (fltype)(0.0377*f);
		op_pt->a1 = (fltype)(10.73*f+1);
		op_pt->a2 = (fltype)(-17.57*f);
		op_pt->a3 = (fltype)(7.42*f);

		step_skip = attackrate*4 + op_pt->toff;
		steps = step_skip >> 2;
		op_pt->env_step_a = (1<<(steps<=12?12-steps:0))-1;

		step_num = (step_skip<=48)?(4-(step_skip&3)):0;
		op_pt->env_step_skip_a = step_skip_mask[step_num];

#if defined(OPLTYPE_IS_OPL3)
		if (step_skip>=60)
#else
		if (step_skip>=62)
#endif
		{
			op_pt->a0 = (fltype)(2.0);	// something that triggers an immediate transition to amp:=1.0
			op_pt->a1 = (fltype)(0.0);
			op_pt->a2 = (fltype)(0.0);
			op_pt->a3 = (fltype)(0.0);
		}
	}
	else
	{
		// attack disabled
		op_pt->a0 = 0.0;
		op_pt->a1 = 1.0;
		op_pt->a2 = 0.0;
		op_pt->a3 = 0.0;
		op_pt->env_step_a = 0;
		op_pt->env_step_skip_a = 0;
	}
}